

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall
Fifteen::moveGraphicTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  QIcon *pQVar1;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *this_00;
  reference pvVar2;
  QIcon nullIcon;
  QPixmap pixmap;
  int local_40;
  _Head_base<0UL,_ImageProvider_*,_false> local_38;
  
  this_00 = TilesBoard::getTiles
                      ((this->tilesBoard)._M_t.
                       super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                       super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                       super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  Controller::getBoardAttributes((Controller *)&local_40);
  pvVar2 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at(this_00,rowDst * (long)local_38._M_head_impl + colDst);
  pQVar1 = (QIcon *)(pvVar2->_M_t).
                    super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                    super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                    super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  ::at(this_00,(long)local_38._M_head_impl * rowSrc + colSrc);
  QAbstractButton::icon();
  QAbstractButton::setIcon(pQVar1);
  QIcon::~QIcon((QIcon *)&pixmap);
  QPixmap::QPixmap(&pixmap,local_40,local_40);
  QColor::QColor((QColor *)&nullIcon,white);
  QPixmap::fill((QColor *)&pixmap);
  QIcon::QIcon(&nullIcon,&pixmap);
  pvVar2 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at(this_00,rowSrc * (long)local_38._M_head_impl + colSrc);
  QAbstractButton::setIcon
            ((QIcon *)(pvVar2->_M_t).
                      super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                      super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                      super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
  QIcon::~QIcon(&nullIcon);
  QPixmap::~QPixmap(&pixmap);
  return;
}

Assistant:

void Fifteen::moveGraphicTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, tileSize ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setIcon( tiles.at( rowSrc * boardSize + colSrc )->icon() );
    QPixmap pixmap( tileSize, tileSize );
    pixmap.fill( Qt::white );
    QIcon nullIcon( pixmap );
    tiles.at( rowSrc * boardSize + colSrc )->setIcon( nullIcon );
}